

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::Triangle::Sample(optional<pbrt::ShapeSample> *__return_storage_ptr__,Triangle *this,Point2f u)

{
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  float fVar15;
  Float FVar16;
  undefined8 uVar26;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar25;
  undefined1 in_register_00001208 [56];
  undefined1 auVar21 [64];
  undefined1 auVar27 [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  array<float,_3> aVar32;
  Vector3<float> VVar33;
  Normal3<float> NVar34;
  Tuple3<pbrt::Normal3,_float> local_138;
  float local_128;
  float fStack_124;
  undefined8 uStack_120;
  undefined1 local_118 [12];
  float fStack_10c;
  undefined1 local_108 [12];
  float fStack_fc;
  undefined8 local_f8;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  Tuple3<pbrt::Point3,_float> local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  Tuple3<pbrt::Vector3,_float> local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Point3fi local_50;
  Tuple3<pbrt::Vector3,_float> local_38;
  
  lVar2 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar10 = (long)this->triIndex;
  lVar3 = *(long *)(lVar2 + 8);
  lVar4 = *(long *)(lVar2 + 0x10);
  lVar11 = (long)*(int *)(lVar3 + lVar10 * 0xc) * 0xc;
  lVar12 = (long)*(int *)(lVar3 + 4 + lVar10 * 0xc) * 0xc;
  lVar13 = (long)*(int *)(lVar3 + 8 + lVar10 * 0xc) * 0xc;
  local_f8 = CONCAT44(local_f8._4_4_,*(undefined4 *)(lVar4 + 8 + lVar11));
  fVar1 = *(float *)(lVar4 + 8 + lVar13);
  local_a8 = *(undefined8 *)(lVar4 + lVar11);
  uStack_a0 = 0;
  uVar26 = *(undefined8 *)(lVar4 + lVar12);
  local_128 = (float)uVar26;
  fStack_124 = (float)((ulong)uVar26 >> 0x20);
  uStack_120 = 0;
  uVar26 = *(undefined8 *)(lVar4 + lVar13);
  local_c8 = (float)uVar26;
  fStack_c4 = (float)((ulong)uVar26 >> 0x20);
  fStack_c0 = 0.0;
  fStack_bc = 0.0;
  local_e8._0_4_ = *(float *)(lVar4 + 8 + lVar12);
  aVar32 = SampleUniformTriangle(u);
  fVar28 = aVar32.values[2];
  auVar21._0_8_ = aVar32.values._0_8_;
  auVar21._8_56_ = in_register_00001208;
  auVar6._8_8_ = uStack_a0;
  auVar6._0_8_ = local_a8;
  auVar14._4_4_ = fStack_124;
  auVar14._0_4_ = local_128;
  auVar14._8_8_ = uStack_120;
  fVar15 = aVar32.values[0];
  _local_108 = auVar21._0_16_;
  local_68 = (float)local_a8 * fVar15;
  fStack_64 = (float)((ulong)local_a8 >> 0x20) * fVar15;
  fStack_60 = (float)uStack_a0 * fVar15;
  fStack_5c = (float)((ulong)uStack_a0 >> 0x20) * fVar15;
  _local_118 = vmovshdup_avx(_local_108);
  local_98 = local_128 * local_118._0_4_;
  fStack_94 = fStack_124 * local_118._4_4_;
  fStack_90 = (float)uStack_120 * local_118._8_4_;
  fStack_8c = (float)((ulong)uStack_120 >> 0x20) * local_118._12_4_;
  fVar25 = (float)local_e8 * local_118._0_4_;
  local_78 = ZEXT416((uint)((float)local_f8 * fVar15));
  auVar5._4_4_ = fStack_c4;
  auVar5._0_4_ = local_c8;
  auVar5._8_4_ = fStack_c0;
  auVar5._12_4_ = fStack_bc;
  local_88 = ZEXT416((uint)fVar25);
  local_d8.z = fVar1 * fVar28 + (float)local_f8 * fVar15 + fVar25;
  auVar29._0_4_ = local_c8 * fVar28 + local_68 + local_98;
  auVar29._4_4_ = fStack_c4 * fVar28 + fStack_64 + fStack_94;
  auVar29._8_4_ = fStack_c0 * fVar28 + fStack_60 + fStack_90;
  auVar29._12_4_ = fStack_bc * fVar28 + fStack_5c + fStack_8c;
  local_d8._0_8_ = vmovlps_avx(auVar29);
  auVar14 = vsubps_avx(auVar14,auVar6);
  local_b8.z = (float)local_e8 - (float)local_f8;
  local_b8._0_8_ = vmovlps_avx(auVar14);
  auVar14 = vsubps_avx(auVar5,auVar6);
  auVar27 = ZEXT856(auVar14._8_8_);
  local_38.z = fVar1 - (float)local_f8;
  local_38._0_8_ = vmovlps_avx(auVar14);
  VVar33 = Cross<float>((Vector3<float> *)&local_b8,(Vector3<float> *)&local_38);
  local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
       VVar33.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._0_8_ = VVar33.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar22._8_56_ = auVar27;
  local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       (Interval)vmovlps_avx(auVar22._0_16_);
  NVar34 = Normalize<float>((Normal3<float> *)&local_50);
  local_138.z = NVar34.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar23._0_8_ = NVar34.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar23._8_56_ = auVar27;
  local_138._0_8_ = vmovlps_avx(auVar23._0_16_);
  if (*(long *)(lVar2 + 0x18) == 0) {
    if (*(char *)(lVar2 + 0x38) != *(char *)(lVar2 + 0x39)) {
      auVar18._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
      auVar18._8_4_ = auVar27._0_4_ ^ 0x80000000;
      auVar18._12_4_ = auVar27._4_4_ ^ 0x80000000;
      local_138._0_8_ = vmovlps_avx(auVar18);
      local_138.z = -local_138.z;
    }
  }
  else {
    fVar25 = (float)local_108._8_4_;
    fVar15 = fStack_fc;
    NVar34 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)
                        (*(long *)(lVar2 + 0x18) + (long)*(int *)(lVar3 + lVar10 * 0xc) * 0xc),
                        (float)local_108._0_4_);
    local_128 = NVar34.super_Tuple3<pbrt::Normal3,_float>.z;
    local_e8 = NVar34.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    local_d8.y = fVar15;
    local_d8.x = fVar25;
    fVar25 = (float)local_118._8_4_;
    fVar15 = fStack_10c;
    NVar34 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)
                        ((long)*(int *)(lVar3 + 4 + lVar10 * 0xc) * 0xc + *(long *)(lVar2 + 0x18)),
                        (float)local_118._0_4_);
    local_f8 = NVar34.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    local_128 = NVar34.super_Tuple3<pbrt::Normal3,_float>.z + local_128;
    uVar26 = 0;
    local_e8._0_4_ = fVar25;
    local_e8._4_4_ = fVar15;
    NVar34 = Tuple3<pbrt::Normal3,float>::operator*
                       ((Tuple3<pbrt::Normal3,float> *)
                        ((long)*(int *)(lVar3 + 8 + lVar10 * 0xc) * 0xc + *(long *)(lVar2 + 0x18)),
                        (1.0 - (float)local_108._0_4_) - (float)local_118._0_4_);
    local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
         NVar34.super_Tuple3<pbrt::Normal3,_float>.z + local_128;
    auVar17._0_4_ = (float)local_f8 + (float)local_e8 + NVar34.super_Tuple3<pbrt::Normal3,_float>.x;
    auVar17._4_4_ = local_f8._4_4_ + local_e8._4_4_ + NVar34.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar17._8_4_ = fStack_f0 + fStack_e0 + (float)uVar26;
    auVar17._12_4_ = fStack_ec + fStack_dc + (float)((ulong)uVar26 >> 0x20);
    auVar27 = ZEXT856(auVar17._8_8_);
    local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
         (Interval)vmovlps_avx(auVar17);
    NVar34 = FaceForward<float>((Normal3<float> *)&local_138,(Normal3<float> *)&local_50);
    local_138.z = NVar34.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar24._0_8_ = NVar34.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar24._8_56_ = auVar27;
    local_138._0_8_ = vmovlps_avx(auVar24._0_16_);
  }
  auVar19._8_4_ = 0x7fffffff;
  auVar19._0_8_ = 0x7fffffff7fffffff;
  auVar19._12_4_ = 0x7fffffff;
  auVar9._4_4_ = fStack_64;
  auVar9._0_4_ = local_68;
  auVar9._8_4_ = fStack_60;
  auVar9._12_4_ = fStack_5c;
  auVar14 = vandps_avx(auVar19,auVar9);
  auVar8._4_4_ = fStack_94;
  auVar8._0_4_ = local_98;
  auVar8._8_4_ = fStack_90;
  auVar8._12_4_ = fStack_8c;
  auVar5 = vandps_avx(auVar19,auVar8);
  auVar6 = vandps_avx(auVar19,local_78);
  auVar29 = vandps_avx(auVar19,local_88);
  fVar25 = (1.0 - (float)local_108._0_4_) - (float)local_118._0_4_;
  auVar31._0_4_ = fVar25 * local_c8;
  auVar31._4_4_ = fVar25 * fStack_c4;
  auVar31._8_4_ = fVar25 * fStack_c0;
  auVar31._12_4_ = fVar25 * fStack_bc;
  auVar18 = vandps_avx(ZEXT416((uint)(fVar25 * fVar1)),auVar19);
  local_b8.z = (auVar6._0_4_ + auVar29._0_4_ + auVar18._0_4_) * 3.57628e-07;
  auVar6 = vandps_avx(auVar31,auVar19);
  auVar20._0_4_ = auVar14._0_4_ + auVar5._0_4_ + auVar6._0_4_;
  auVar20._4_4_ = auVar14._4_4_ + auVar5._4_4_ + auVar6._4_4_;
  auVar20._8_4_ = auVar14._8_4_ + auVar5._8_4_ + auVar6._8_4_;
  auVar20._12_4_ = auVar14._12_4_ + auVar5._12_4_ + auVar6._12_4_;
  auVar7._8_4_ = 0x34c00005;
  auVar7._0_8_ = 0x34c0000534c00005;
  auVar7._12_4_ = 0x34c00005;
  auVar14 = vmulps_avx512vl(auVar20,auVar7);
  local_b8._0_8_ = vmovlps_avx(auVar14);
  Point3fi::Point3fi(&local_50,(Point3f *)&local_d8,(Vector3f *)&local_b8);
  *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
       local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  local_108._0_4_ = local_138.x;
  local_108._4_4_ = local_138.y;
  local_118._0_4_ = local_138.z;
  (__return_storage_ptr__->optionalValue).__align =
       (anon_struct_8_0_00000001_for___align)
       local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
       CONCAT44(local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                high,local_50.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low);
  FVar16 = Area(this);
  __return_storage_ptr__->set = true;
  auVar30._0_12_ = ZEXT812(0);
  auVar30._12_4_ = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar30;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = local_108._0_8_;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_118._0_4_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar30;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 1.0 / FVar16;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Sample point on triangle uniformly by area
        pstd::array<Float, 3> b = SampleUniformTriangle(u);
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;

        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n != nullptr) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        return ShapeSample{Interaction(Point3fi(p, pError), n), 1 / Area()};
    }